

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
          (QDataStream *s,QHash<QFont::Tag,_unsigned_int> *c)

{
  Status SVar1;
  qint64 qVar2;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  mapped_type_conflict1 t;
  key_type k;
  StreamStateSaver stateSaver;
  QDataStream *in_stack_ffffffffffffff88;
  StreamStateSaver *in_stack_ffffffffffffff90;
  Data<QHashPrivate::Node<QFont::Tag,_unsigned_int>_> *stream;
  piter in_stack_ffffffffffffff98;
  long local_58;
  Tag local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QHash<QFont::Tag,_unsigned_int>::clear
            ((QHash<QFont::Tag,_unsigned_int> *)in_stack_ffffffffffffff90);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffff90);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    for (local_58 = 0; stream = in_stack_ffffffffffffff98.d, local_58 < qVar2;
        local_58 = local_58 + 1) {
      local_1c.m_value = 0xaaaaaaaa;
      QFont::Tag::Tag(&local_1c);
      ::operator>>((QDataStream *)stream,(Tag *)in_stack_ffffffffffffff90);
      QDataStream::operator>>
                ((QDataStream *)in_stack_ffffffffffffff90,(quint32 *)in_stack_ffffffffffffff88);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 != Ok) {
        QHash<QFont::Tag,_unsigned_int>::clear
                  ((QHash<QFont::Tag,_unsigned_int> *)in_stack_ffffffffffffff90);
        break;
      }
      in_stack_ffffffffffffff98 =
           (piter)QHash<QFont::Tag,_unsigned_int>::insert
                            ((QHash<QFont::Tag,_unsigned_int> *)in_stack_ffffffffffffff90,
                             (Tag *)in_stack_ffffffffffffff88,(uint *)0x7321a4);
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}